

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  EnumDescriptor *pEVar1;
  long lVar2;
  ctrl_t *pcVar3;
  long lVar4;
  undefined8 uVar5;
  bool bVar6;
  uintptr_t v;
  slot_type *ppEVar7;
  size_t sVar8;
  uint64_t v_3;
  ulong uVar9;
  byte bVar10;
  size_t sVar11;
  byte bVar12;
  ctrl_t cVar13;
  ulong uVar14;
  ulong uVar15;
  FindInfo FVar16;
  HashSetResizeHelper resize_helper;
  undefined1 local_5a;
  undefined1 local_59;
  HeapOrSoo local_58;
  size_t local_48;
  byte local_40;
  char local_3f;
  byte local_3e;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe92,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::EnumValueDescriptor *>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::EnumValueDescriptor *>]"
                 );
  }
  if (new_capacity < 2) {
    __assert_fail("(!set->fits_in_soo(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe93,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::EnumValueDescriptor *>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::EnumValueDescriptor *>]"
                 );
  }
  sVar8 = common->capacity_;
  if (sVar8 == 0) {
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::EnumValueDescriptor *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::EnumValueDescriptor *>]"
                 );
  }
  bVar10 = 0x80;
  if (sVar8 == 1) {
    AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                *)0x1);
    if (1 < common->size_) {
      ppEVar7 = soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                          *)common);
      pEVar1 = (*ppEVar7)->type_;
      uVar9 = ((ulong)pEVar1 ^ 0x572bc8) * -0x234dd359734ecb13;
      uVar9 = ((uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 | (uVar9 & 0xff00) << 0x28 |
               uVar9 << 0x38) ^ (ulong)pEVar1) * -0x234dd359734ecb13;
      bVar10 = (byte)(((uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                        (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                        (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                        (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38) ^ (ulong)(uint)(*ppEVar7)->number_
                      ) * 0x5cb22ca68cb134ed >> 0x38) & 0x7f;
      bVar12 = 1;
      goto LAB_0022e9da;
    }
  }
  bVar12 = 0;
LAB_0022e9da:
  local_48 = common->capacity_;
  local_40 = (byte)common->size_ & 1;
  local_3f = sVar8 == 1;
  local_58.heap.control = (common->heap_or_soo_).heap.control;
  local_58.heap.slot_array =
       (MaybeInitializedPtr)((MaybeInitializedPtr *)((long)&common->heap_or_soo_ + 8))->p;
  local_3e = bVar12;
  CommonFields::set_capacity(common,new_capacity);
  bVar6 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,8ul,true,true,8ul>
                    ((HashSetResizeHelper *)&local_58,common,&local_59,(int)(char)bVar10,8,8);
  if (local_48 == 0) {
    __assert_fail("(resize_helper.old_capacity() > 0) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xeb6,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::EnumValueDescriptor *>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::EnumValueDescriptor *>]"
                 );
  }
  if ((bVar12 | sVar8 != 1) == 1) {
    lVar2 = *(long *)((long)&common->heap_or_soo_ + 8);
    slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                *)common->capacity_);
    uVar5 = local_58.heap.slot_array;
    if (!bVar6) {
      if (sVar8 == 1) {
        uVar9 = (*(undefined8 *)(local_58.heap.control + 0x10) ^ 0x572bc8) * -0x234dd359734ecb13;
        uVar9 = ((uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                  (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                  (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 | (uVar9 & 0xff00) << 0x28
                 | uVar9 << 0x38) ^ *(undefined8 *)(local_58.heap.control + 0x10)) *
                -0x234dd359734ecb13;
        uVar14 = ((uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                   (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                   (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 | (uVar9 & 0xff00) << 0x28
                  | uVar9 << 0x38) ^ (ulong)(uint)*(undefined4 *)(local_58.heap.control + 4)) *
                 -0x234dd359734ecb13;
        FVar16 = find_first_non_full<void>
                           (common,uVar14 >> 0x38 | (uVar14 & 0xff000000000000) >> 0x28 |
                                   (uVar14 & 0xff0000000000) >> 0x18 | (uVar14 & 0xff00000000) >> 8
                                   | (uVar14 & 0xff000000) << 8 | (uVar14 & 0xff0000) << 0x18 |
                                   (uVar14 & 0xff00) << 0x28 | uVar14 << 0x38);
        uVar15 = FVar16.offset;
        uVar9 = common->capacity_;
        if (uVar9 <= uVar15) {
LAB_0022ec25:
          __assert_fail("(i < c.capacity()) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x744,
                        "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                       );
        }
        cVar13 = (ctrl_t)(uVar14 >> 0x38) & ~kEmpty;
        pcVar3 = (common->heap_or_soo_).heap.control;
        pcVar3[uVar15] = cVar13;
        pcVar3[(ulong)((uint)uVar9 & 0xf) + (uVar15 - 0xf & uVar9)] = cVar13;
        common->capacity_ = 0xffffffffffffff9c;
        *(ctrl_t **)(lVar2 + uVar15 * 8) = local_58.heap.control;
        CommonFields::set_capacity(common,uVar9);
      }
      else {
        if (local_3f == '\x01') {
          __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7ea,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        if (local_48 != 0) {
          sVar11 = 0;
          sVar8 = local_48;
          do {
            if (local_3f == '\x01') {
              __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7e6,
                            "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const"
                           );
            }
            if (kSentinel < local_58.heap.control[sVar11]) {
              lVar4 = *(long *)(uVar5 + sVar11 * 8);
              uVar9 = *(ulong *)(lVar4 + 0x10);
              uVar15 = (uVar9 ^ (ulong)&hash_internal::MixingHashState::kSeed) * -0x234dd359734ecb13
              ;
              uVar9 = ((uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 |
                        (uVar15 & 0xff0000000000) >> 0x18 | (uVar15 & 0xff00000000) >> 8 |
                        (uVar15 & 0xff000000) << 8 | (uVar15 & 0xff0000) << 0x18 |
                        (uVar15 & 0xff00) << 0x28 | uVar15 << 0x38) ^ uVar9) * -0x234dd359734ecb13;
              uVar14 = ((uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                         (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                         (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                         (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38) ^ (ulong)*(uint *)(lVar4 + 4)) *
                       -0x234dd359734ecb13;
              FVar16 = find_first_non_full<void>
                                 (common,uVar14 >> 0x38 | (uVar14 & 0xff000000000000) >> 0x28 |
                                         (uVar14 & 0xff0000000000) >> 0x18 |
                                         (uVar14 & 0xff00000000) >> 8 | (uVar14 & 0xff000000) << 8 |
                                         (uVar14 & 0xff0000) << 0x18 | (uVar14 & 0xff00) << 0x28 |
                                         uVar14 << 0x38);
              uVar15 = FVar16.offset;
              uVar9 = common->capacity_;
              if (uVar9 <= uVar15) goto LAB_0022ec25;
              cVar13 = (ctrl_t)(uVar14 >> 0x38) & ~kEmpty;
              pcVar3 = (common->heap_or_soo_).heap.control;
              pcVar3[uVar15] = cVar13;
              pcVar3[(ulong)((uint)uVar9 & 0xf) + (uVar15 - 0xf & uVar9)] = cVar13;
              common->capacity_ = 0xffffffffffffff9c;
              *(undefined8 *)(lVar2 + uVar15 * 8) = *(undefined8 *)(uVar5 + sVar11 * 8);
              CommonFields::set_capacity(common,uVar9);
              sVar8 = local_48;
            }
            sVar11 = sVar11 + 1;
          } while (sVar11 != sVar8);
        }
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
        HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                  ((HashSetResizeHelper *)&local_58,&local_5a,8);
      }
    }
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }